

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobjectdefs.h
# Opt level: O0

R_conflict1 *
QtPrivate::invokeMethodHelper<QMetaMethodArgument,QMetaMethodArgument>
          (QMetaMethodReturnArgument r,QMetaMethodArgument *arguments,
          QMetaMethodArgument *arguments_1)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  QMetaTypeInterface *pQVar6;
  QMetaTypeInterface *pQVar7;
  QMetaMethodArgument *in_RDX;
  QMetaMethodArgument *in_RSI;
  R_conflict1 *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  array<const_QtPrivate::QMetaTypeInterface_*,_3UL> types;
  array<const_char_*,_3UL> names;
  array<const_void_*,_3UL> params;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = Invoke::dataHelper(*in_RSI);
  pvVar3 = Invoke::dataHelper(*in_RDX);
  pcVar4 = Invoke::typenameHelper(*in_RSI);
  pcVar5 = Invoke::typenameHelper(*in_RDX);
  pQVar6 = Invoke::metaTypeHelper(*in_RSI);
  pQVar7 = Invoke::metaTypeHelper(*in_RDX);
  (in_RDI->parameters)._M_elems[2] = pvVar3;
  (in_RDI->parameters)._M_elems[0] = in_stack_00000018;
  (in_RDI->parameters)._M_elems[1] = pvVar2;
  (in_RDI->typeNames)._M_elems[2] = pcVar5;
  (in_RDI->typeNames)._M_elems[0] = in_stack_00000010;
  (in_RDI->typeNames)._M_elems[1] = pcVar4;
  (in_RDI->metaTypes)._M_elems[2] = pQVar7;
  local_68 = (undefined4)in_stack_00000008;
  uStack_64 = (undefined4)((ulong)in_stack_00000008 >> 0x20);
  uStack_60 = SUB84(pQVar6,0);
  uStack_5c = (undefined4)((ulong)pQVar6 >> 0x20);
  *(undefined4 *)(in_RDI->metaTypes)._M_elems = local_68;
  *(undefined4 *)((long)(in_RDI->metaTypes)._M_elems + 4) = uStack_64;
  *(undefined4 *)((in_RDI->metaTypes)._M_elems + 1) = uStack_60;
  *(undefined4 *)((long)(in_RDI->metaTypes)._M_elems + 0xc) = uStack_5c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline auto invokeMethodHelper(QMetaMethodReturnArgument r, const Args &... arguments)
{
    std::array params = { const_cast<const void *>(r.data), Invoke::dataHelper(arguments)... };
    std::array names = { r.name, Invoke::typenameHelper(arguments)... };
    std::array types = { r.metaType, Invoke::metaTypeHelper(arguments)... };
    static_assert(params.size() == types.size());
    static_assert(params.size() == names.size());

    struct R {
        decltype(params) parameters;
        decltype(names) typeNames;
        decltype(types) metaTypes;
        constexpr qsizetype parameterCount() const { return qsizetype(parameters.size()); }
    };
    return R { params, names, types };
}